

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
* toml::detail::parse_comment_line<toml::type_config>
            (result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  char_type_conflict cVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *v;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *v_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__t;
  char (*in_R9) [65];
  allocator<char> local_2f2;
  allocator<char> local_2f1;
  undefined1 local_2f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  undefined1 local_2b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290 [4];
  undefined1 local_248 [88];
  location first;
  region com_reg;
  source_location local_140;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  error_info local_78;
  
  location::location(&first,loc);
  skip_whitespace<toml::type_config>(loc,ctx);
  syntax::comment((sequence *)local_2b0,&ctx->toml_spec_);
  sequence::scan(&com_reg,(sequence *)local_2b0,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_2b0 + 8));
  if (com_reg.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    location::operator=(loc,&first);
    local_290[0]._M_local_buf[0] = '\0';
    ok<std::optional<std::__cxx11::string>>
              ((success<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_c8,(toml *)local_2b0,v_00);
    result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
    ::result(__return_storage_ptr__,(success_type *)&local_c8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_c8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2b0);
    goto LAB_0030b305;
  }
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (loc->location_ <
      (ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start)) {
    syntax::newline((either *)local_248,&ctx->toml_spec_);
    either::scan((region *)local_2b0,(either *)local_248,loc);
    region::~region((region *)local_2b0);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_248 + 8));
    if ((pointer)local_2b0._0_8_ != (pointer)0x0) goto LAB_0030b258;
    do {
      peVar1 = (loc->source_).
               super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if ((ulong)((long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start) <= loc->location_)
      goto LAB_0030b367;
      location::advance(loc,1);
      cVar2 = location::current(loc);
    } while (cVar2 != '\n');
    location::advance(loc,1);
LAB_0030b367:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_2f0 + 0x20),
               "toml::parse_comment_line: newline (LF / CRLF) or EOF is expected",&local_2f1);
    region::region((region *)local_2b0,loc);
    source_location::source_location(&local_140,(region *)local_2b0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2f0,"but got this",&local_2f2);
    make_error_info<char_const(&)[65]>
              ((error_info *)local_248,(toml *)(local_2f0 + 0x20),(string *)&local_140,
               (source_location *)local_2f0,
               (string *)"Hint: most of the control characters are not allowed in comments",in_R9);
    err<toml::error_info>((failure<toml::error_info> *)&local_78,(error_info *)local_248);
    result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
    ::result(__return_storage_ptr__,(failure_type *)&local_78);
    error_info::~error_info(&local_78);
    error_info::~error_info((error_info *)local_248);
    std::__cxx11::string::~string((string *)local_2f0);
    source_location::~source_location(&local_140);
    region::~region((region *)local_2b0);
    __t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2f0 + 0x20);
  }
  else {
LAB_0030b258:
    region::as_string_abi_cxx11_((string *)local_248,&com_reg);
    __t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2b0,__t);
    ok<std::optional<std::__cxx11::string>>
              ((success<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_a0,(toml *)local_2b0,v);
    result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
    ::result(__return_storage_ptr__,(success_type *)&local_a0);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_a0);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2b0);
  }
  std::__cxx11::string::~string((string *)__t);
LAB_0030b305:
  region::~region(&com_reg);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<cxx::optional<std::string>, error_info>
parse_comment_line(location& loc, context<TC>& ctx)
{
    const auto& spec = ctx.toml_spec();
    const auto first = loc;

    skip_whitespace(loc, ctx);

    const auto com_reg = syntax::comment(spec).scan(loc);
    if(com_reg.is_ok())
    {
        // once comment started, newline must follow (or reach EOF).
        if( ! loc.eof() && ! syntax::newline(spec).scan(loc).is_ok())
        {
            while( ! loc.eof()) // skip until newline to continue parsing
            {
                loc.advance();
                if(loc.current() == '\n') { /*skip LF*/ loc.advance(); break; }
            }
            return err(make_error_info("toml::parse_comment_line: "
                "newline (LF / CRLF) or EOF is expected",
                source_location(region(loc)), "but got this",
                "Hint: most of the control characters are not allowed in comments"));
        }
        return ok(cxx::optional<std::string>(com_reg.as_string()));
    }
    else
    {
        loc = first; // rollback whitespace to parse indent
        return ok(cxx::optional<std::string>(cxx::make_nullopt()));
    }
}